

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void test_rsa_sign(void)

{
  ptls_sign_certificate_t *ppVar1;
  EVP_PKEY *key;
  int iVar2;
  EVP_MD *md;
  ptls_iovec_t signature;
  ptls_iovec_t data;
  ptls_iovec_t input;
  ptls_buffer_t sigbuf;
  uint8_t sigbuf_small [1024];
  
  ppVar1 = ctx->sign_certificate;
  sigbuf.base = sigbuf_small;
  sigbuf.off = 0;
  sigbuf.capacity = 0x400;
  sigbuf.is_allocated = 0;
  key = (EVP_PKEY *)ppVar1[1].cb;
  md = EVP_sha256();
  input.len = 0xb;
  input.base = (uint8_t *)"hello world";
  iVar2 = do_sign(key,&sigbuf,input,(EVP_MD *)md);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0x8d);
  EVP_PKEY_up_ref(ppVar1[1].cb);
  signature.len = sigbuf.off;
  signature.base = sigbuf.base;
  data.len = 0xb;
  data.base = (uint8_t *)"hello world";
  iVar2 = verify_sign(ppVar1[1].cb,data,signature);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0x8f);
  ptls_buffer_dispose(&sigbuf);
  return;
}

Assistant:

static void test_rsa_sign(void)
{
    ptls_openssl_sign_certificate_t *sc = (ptls_openssl_sign_certificate_t *)ctx->sign_certificate;

    const void *message = "hello world";
    ptls_buffer_t sigbuf;
    uint8_t sigbuf_small[1024];

    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));
    ok(do_sign(sc->key, &sigbuf, ptls_iovec_init(message, strlen(message)), EVP_sha256()) == 0);
    EVP_PKEY_up_ref(sc->key);
    ok(verify_sign(sc->key, ptls_iovec_init(message, strlen(message)), ptls_iovec_init(sigbuf.base, sigbuf.off)) == 0);

    ptls_buffer_dispose(&sigbuf);
}